

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16a64::AckermannTask::inputsAvailable(AckermannTask *this,TaskInterface ti)

{
  AckermannValue *this_00;
  TaskInterface local_38;
  int local_24;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  local_38.ctx = ti.ctx;
  local_38.impl = ti.impl;
  if (this->m == 0) {
    local_24 = this->n + 1;
    this_00 = (AckermannValue *)&local_24;
  }
  else {
    if ((this->recursiveResultA).value == 0) {
      __assert_fail("recursiveResultA != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xb4,
                    "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                   );
    }
    if (this->n == 0) {
      this_00 = (AckermannValue *)&this->recursiveResultA;
    }
    else {
      if ((this->recursiveResultB).value == 0) {
        __assert_fail("recursiveResultB != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                      ,0xba,
                      "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                     );
      }
      this_00 = (AckermannValue *)&this->recursiveResultB;
    }
  }
  (anonymous_namespace)::AckermannValue::operator_cast_to_vector((ValueType *)&local_20,this_00);
  llbuild::core::TaskInterface::complete(&local_38,(ValueType *)&local_20,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
    if (m == 0) {
      ti.complete(AckermannValue(n + 1));
      return;
    }

    assert(recursiveResultA != 0);
    if (n == 0) {
      ti.complete(recursiveResultA);
      return;
    }

    assert(recursiveResultB != 0);
    ti.complete(recursiveResultB);
  }